

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall
RandomForest::Node<float>::GetSampleList
          (Node<float> *this,shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_posSampleList,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_negSampleList)

{
  Node<float> *pNVar1;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar2;
  reference pvVar3;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *psVar4;
  ulong __n;
  int tempIndex;
  int local_88;
  float local_84;
  undefined1 local_80 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (this->featureIndex == -1) {
    for (__n = 0; this_00 = (this->sampleIndexList).
                            super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,
        __n < (ulong)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); __n = __n + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(this_00,__n);
      local_88 = *pvVar2;
      ODTree<float>::GetTrainData((ODTree<float> *)local_80);
      pvVar3 = std::
               vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
               ::at((vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>
                     *)local_80._0_8_,(long)local_88);
      local_84 = (((pvVar3->
                   super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1];
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
      psVar4 = o_negSampleList;
      if (0.0 < local_84) {
        psVar4 = o_posSampleList;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((psVar4->
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr,&local_88);
    }
  }
  else {
    pNVar1 = (this->left).super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pNVar1 != (Node<float> *)0x0) {
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_40,
                   &o_posSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_50,
                   &o_negSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      GetSampleList(pNVar1,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)&local_40,
                    (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    pNVar1 = (this->right).super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (pNVar1 != (Node<float> *)0x0) {
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_80 + 0x20),
                   &o_posSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)(local_80 + 0x10),
                   &o_negSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
      GetSampleList(pNVar1,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)(local_80 + 0x20),
                    (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)(local_80 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    }
  }
  return;
}

Assistant:

void RandomForest::Node<T>::GetSampleList(std::shared_ptr<std::vector<int> > o_posSampleList, std::shared_ptr<std::vector<int> > o_negSampleList) const
{
    if (featureIndex==-1)
    {
        for(int i=0; i<sampleIndexList->size(); i++)
        {
            int tempIndex=sampleIndexList->at(i);
            T label=tree->GetTrainData()->at(tempIndex)->back();
            if (label > 0)
            {
                o_posSampleList->push_back(tempIndex);
            }
            else{
                o_negSampleList->push_back(tempIndex);
            }
        }
        return;
    }
    if (left)
    {
        left->GetSampleList(o_posSampleList,o_negSampleList);
    }

    if (right)
    {
        right->GetSampleList(o_posSampleList,o_negSampleList);
    }
}